

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

value_t __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
::compute_diameter(Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
                   *this,simplex_t index,dimension_t dim)

{
  pointer piVar1;
  uint uVar2;
  int n;
  undefined7 in_register_00000011;
  ulong uVar3;
  ulong uVar4;
  value_t vVar5;
  value_t vVar6;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
  local_30 [8];
  pointer local_28;
  
  n = (int)CONCAT71(in_register_00000011,dim);
  std::vector<int,_std::allocator<int>_>::resize(&this->vertices,(long)n + 1);
  local_28 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
  ::
  get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (local_30,(simplex_t)this,(dimension_t)index,n,
             (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)(ulong)(uint)((int)((ulong)((long)(this->dist).neighbors.
                                                  super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->dist).neighbors.
                                                 super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x55555555));
  if (dim < '\0') {
    vVar5 = -INFINITY;
  }
  else {
    vVar5 = -INFINITY;
    uVar3 = 0;
    do {
      uVar4 = uVar3 & 0xff;
      if ('\0' < (char)uVar3) {
        uVar3 = 0;
        vVar6 = vVar5;
        do {
          piVar1 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          vVar5 = Sparse_distance_matrix<Params>::operator()
                            (&this->dist,piVar1[uVar4],piVar1[uVar3]);
          if (vVar5 <= vVar6) {
            vVar5 = vVar6;
          }
          uVar3 = uVar3 + 1;
          vVar6 = vVar5;
        } while (uVar4 != uVar3);
      }
      uVar2 = (int)uVar4 + 1;
      uVar3 = (ulong)uVar2;
    } while ((char)uVar2 <= dim);
  }
  return vVar5;
}

Assistant:

value_t compute_diameter(const simplex_t index, const dimension_t dim) const {
    value_t diam = -std::numeric_limits<value_t>::infinity();

    vertices.resize(dim + 1);
    get_simplex_vertices(index, dim, dist.size(), vertices.rbegin());

    for (dimension_t i = 0; i <= dim; ++i)
      for (dimension_t j = 0; j < i; ++j) {
        diam = std::max(diam, dist(vertices[i], vertices[j]));
      }
    return diam;
  }